

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O1

bool __thiscall
tinyusdz::SkelAnimation::get_translations
          (SkelAnimation *this,
          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vals,double t,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> v;
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  local_58;
  
  local_58._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_58._ts._17_8_ = 0;
  local_58._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_58._ts._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_58._value.
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._value.
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0;
  local_58._value.
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish._2_6_ = 0;
  local_58._value.
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_58._value.
  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_6_ = 0;
  local_58._has_value = false;
  local_58._blocked = false;
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
          ::get_value(&this->translations,&local_58);
  if (bVar1) {
    bVar1 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::get(&local_58,t,vals,tinterp);
  }
  else {
    bVar1 = false;
  }
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
  ::~vector(&local_58._ts._samples);
  if (local_58._value.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58._value.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT62(local_58._value.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._2_6_,
                             local_58._value.
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_) -
                    (long)local_58._value.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SkelAnimation::get_translations(
    std::vector<value::float3> *vals, const double t,
    const value::TimeSampleInterpolationType tinterp) {
  Animatable<std::vector<value::float3>> v;
  if (translations.get_value(&v)) {
    // Evaluate at time `t` with `tinterp` interpolation
    return v.get(t, vals, tinterp);
  }

  return false;
}